

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigMan.c
# Opt level: O3

Aig_Man_t * Aig_ManStart(int nNodesMax)

{
  int iVar1;
  uint uVar2;
  Aig_Man_t *pAVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  Vec_Ptr_t *pVVar6;
  Aig_MmFixed_t *p;
  Aig_Obj_t *pAVar7;
  Aig_Obj_t **ppAVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  
  iVar9 = 0x2717;
  if (0 < nNodesMax) {
    iVar9 = nNodesMax;
  }
  pAVar3 = (Aig_Man_t *)calloc(1,0x210);
  pAVar3->nTravIds = 1;
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  pVVar4->nCap = 100;
  pVVar4->nSize = 0;
  ppvVar5 = (void **)malloc(800);
  pVVar4->pArray = ppvVar5;
  pAVar3->vCis = pVVar4;
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  pVVar4->nCap = 100;
  pVVar4->nSize = 0;
  ppvVar5 = (void **)malloc(800);
  pVVar4->pArray = ppvVar5;
  pAVar3->vCos = pVVar4;
  pVVar4 = (Vec_Ptr_t *)malloc(0x10);
  pVVar4->nCap = 1000;
  pVVar4->nSize = 0;
  ppvVar5 = (void **)malloc(8000);
  pVVar4->pArray = ppvVar5;
  pAVar3->vObjs = pVVar4;
  pVVar6 = (Vec_Ptr_t *)malloc(0x10);
  pVVar6->nCap = 100;
  pVVar6->nSize = 0;
  ppvVar5 = (void **)malloc(800);
  pVVar6->pArray = ppvVar5;
  pAVar3->vBufs = pVVar6;
  pVVar6 = (Vec_Ptr_t *)malloc(0x10);
  pVVar6->nCap = 8;
  pVVar6->nSize = 0;
  ppvVar5 = (void **)malloc(0x40);
  pVVar6->pArray = ppvVar5;
  pAVar3->unfold2_type_I = pVVar6;
  pVVar6 = (Vec_Ptr_t *)malloc(0x10);
  pVVar6->nCap = 8;
  pVVar6->nSize = 0;
  ppvVar5 = (void **)malloc(0x40);
  pVVar6->pArray = ppvVar5;
  pAVar3->unfold2_type_II = pVVar6;
  p = Aig_MmFixedStart(0x30,iVar9);
  pAVar3->pMemObjs = p;
  pAVar7 = (Aig_Obj_t *)Aig_MmFixedEntryFetch(p);
  (pAVar7->field_0).pNext = (Aig_Obj_t *)0x0;
  pAVar7->pFanin0 = (Aig_Obj_t *)0x0;
  pAVar7->pFanin1 = (Aig_Obj_t *)0x0;
  *(undefined8 *)&pAVar7->field_0x18 = 0;
  pAVar7->TravId = 0;
  pAVar7->Id = 0;
  (pAVar7->field_5).pData = (void *)0x0;
  uVar10 = pVVar4->nSize;
  pAVar7->Id = uVar10;
  if (uVar10 == pVVar4->nCap) {
    if ((int)uVar10 < 0x10) {
      if (pVVar4->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc(0x80);
      }
      else {
        ppvVar5 = (void **)realloc(pVVar4->pArray,0x80);
      }
      pVVar4->pArray = ppvVar5;
      pVVar4->nCap = 0x10;
    }
    else {
      if (pVVar4->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc((ulong)uVar10 << 4);
      }
      else {
        ppvVar5 = (void **)realloc(pVVar4->pArray,(ulong)uVar10 << 4);
      }
      pVVar4->pArray = ppvVar5;
      pVVar4->nCap = uVar10 * 2;
    }
  }
  else {
    ppvVar5 = pVVar4->pArray;
  }
  iVar1 = pVVar4->nSize;
  pVVar4->nSize = iVar1 + 1;
  ppvVar5[iVar1] = pAVar7;
  pAVar3->pConst1 = pAVar7;
  *(ulong *)&pAVar7->field_0x18 = *(ulong *)&pAVar7->field_0x18 & 0xfffffffffffffff0 | 9;
  pAVar3->nObjs[1] = 1;
  uVar10 = iVar9 - 1;
  while( true ) {
    do {
      uVar11 = uVar10 + 1;
      uVar2 = uVar10 & 1;
      uVar10 = uVar11;
    } while (uVar2 != 0);
    if (uVar11 < 9) break;
    iVar9 = 5;
    while( true ) {
      if (uVar11 % (iVar9 - 2U) == 0) break;
      uVar2 = iVar9 * iVar9;
      iVar9 = iVar9 + 2;
      if (uVar11 < uVar2) goto LAB_006bfea5;
    }
  }
LAB_006bfea5:
  pAVar3->nTableSize = uVar11;
  ppAVar8 = (Aig_Obj_t **)calloc(1,(long)(int)uVar11 << 3);
  pAVar3->pTable = ppAVar8;
  return pAVar3;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Starts the AIG manager.]

  Description [The argument of this procedure is a soft limit on the
  the number of nodes, or 0 if the limit is unknown.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Aig_Man_t * Aig_ManStart( int nNodesMax )
{
    Aig_Man_t * p;
    if ( nNodesMax <= 0 )
        nNodesMax = 10007;
    // start the manager
    p = ABC_ALLOC( Aig_Man_t, 1 );
    memset( p, 0, sizeof(Aig_Man_t) );
    // perform initializations
    p->nTravIds = 1;
    p->fCatchExor = 0;
    // allocate arrays for nodes
    p->vCis  = Vec_PtrAlloc( 100 );
    p->vCos  = Vec_PtrAlloc( 100 );
    p->vObjs = Vec_PtrAlloc( 1000 );
    p->vBufs = Vec_PtrAlloc( 100 );
    //--jlong -- begin
       p->unfold2_type_I = Vec_PtrAlloc( 4);
       p->unfold2_type_II = Vec_PtrAlloc( 4);
       //--jlong -- end
    // prepare the internal memory manager
    p->pMemObjs = Aig_MmFixedStart( sizeof(Aig_Obj_t), nNodesMax );
    // create the constant node
    p->pConst1 = Aig_ManFetchMemory( p );
    p->pConst1->Type = AIG_OBJ_CONST1;
    p->pConst1->fPhase = 1;
    p->nObjs[AIG_OBJ_CONST1]++;
    // start the table
    p->nTableSize = Abc_PrimeCudd( nNodesMax );
    p->pTable = ABC_ALLOC( Aig_Obj_t *, p->nTableSize );
    memset( p->pTable, 0, sizeof(Aig_Obj_t *) * p->nTableSize );
    return p;
}